

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

void __thiscall BN::BN(BN *this,string *str,RadixBN radix)

{
  bool bVar1;
  ushort uVar2;
  reference pcVar3;
  size_type sVar4;
  char *pcVar5;
  invalid_argument *this_00;
  reference pvVar6;
  allocator local_109;
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [38];
  ushort local_a2;
  ulong uStack_a0;
  bt d;
  size_t i_1;
  size_t shift;
  size_t index;
  size_t length;
  bt local_64;
  char local_61;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_60;
  char i;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  undefined1 local_38 [8];
  BN bn;
  RadixBN radix_local;
  string *str_local;
  BN *this_local;
  
  bn.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = radix;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->ba);
  if (bn.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == dec) {
    BN((BN *)local_38,1,0);
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_60._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffa0), bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      local_61 = *pcVar3;
      if (('/' < local_61) && (local_61 < ':')) {
        local_64 = 10;
        mulbaseappr((BN *)local_38,&local_64);
        BN((BN *)&length,(long)(local_61 + -0x30));
        operator+=((BN *)local_38,(BN *)&length);
        ~BN((BN *)&length);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
              (&this->ba,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
    ~BN((BN *)local_38);
  }
  else {
    index = std::__cxx11::string::size();
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,index + 3 >> 2);
    sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
    shift = sVar4 - 1;
    sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
    i_1 = 4 - (sVar4 * 4 - index);
    for (uStack_a0 = 0; uStack_a0 < index; uStack_a0 = uStack_a0 + 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
      if ((*pcVar5 < '0') ||
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str), '9' < *pcVar5)) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
        if ((*pcVar5 < 'A') ||
           (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str), 'F' < *pcVar5)) {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
          if ((*pcVar5 < 'a') ||
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str), 'f' < *pcVar5)) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_108,"BN constructor: invalid char \'",&local_109);
            std::__cxx11::string::operator[]((ulong)str);
            std::operator+(local_e8,(char)local_108);
            std::operator+(local_c8,(char *)local_e8);
            std::invalid_argument::invalid_argument(this_00,(string *)local_c8);
            __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
          local_a2 = (short)*pcVar5 - 0x57;
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
          local_a2 = (short)*pcVar5 - 0x37;
        }
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
        local_a2 = (short)*pcVar5 - 0x30;
      }
      pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->ba,shift);
      uVar2 = *pvVar6 << 4 | local_a2;
      pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->ba,shift);
      *pvVar6 = uVar2;
      i_1 = i_1 - 1;
      if (i_1 == 0) {
        i_1 = 4;
        shift = shift - 1;
      }
    }
    anon_unknown.dwarf_102a0::Norm(&this->ba);
  }
  return;
}

Assistant:

BN::BN(const string &str, RadixBN radix)
{
    if(radix == RadixBN::dec)
    {
        BN bn(1,0);
        for (auto i : str) {
            if (i < '0' || i > '9')
                continue;
            bn.mulbaseappr(10);
            bn += BN(i - '0');
        }
        ba = move(bn.ba);
        return;
    }

    // radix: hex
    size_t length = str.size();
    ba.resize((length + bz * 2 - 1) / (bz * 2));

    size_t index = ba.size() - 1;
    size_t shift = bz * 2 - (ba.size() * bz * 2 - length);

    for (size_t i = 0; i < length; ++i) {
        bt d;
        if (str[i] >= '0' && str[i] <= '9')
            d = str[i] - '0';
        else if (str[i] >= 'A' && str[i] <= 'F')
            d = str[i] - 'A' + 10;
        else if (str[i] >= 'a' && str[i] <= 'f')
            d = str[i] - 'a' + 10;
        else
            throw invalid_argument(string("BN constructor: invalid char '") + str[i] + "' in HEX string");
        ba[index] = (ba[index] << 4) | d;
        --shift;
        if (shift == 0) {
            shift = bz * 2;
            --index;
        }
    }
    Norm(ba);
}